

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O0

string * __thiscall
cmsys::Directory::GetFilePath_abi_cxx11_(string *__return_storage_ptr__,Directory *this,size_t i)

{
  ulong uVar1;
  char *pcVar2;
  string *psVar3;
  size_t i_local;
  Directory *this_local;
  string *abs;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->Internal->Path);
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) == 0) && (pcVar2 = (char *)std::__cxx11::string::back(), *pcVar2 != '/')) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'/');
  }
  psVar3 = (string *)
           std::
           vector<cmsys::DirectoryInternals::FileData,_std::allocator<cmsys::DirectoryInternals::FileData>_>
           ::operator[](&this->Internal->Files,i);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,psVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string Directory::GetFilePath(std::size_t i) const
{
  std::string abs = this->Internal->Path;
  if (!abs.empty() && abs.back() != '/') {
    abs += '/';
  }
  abs += this->Internal->Files[i].Name;
  return abs;
}